

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall
llbuild::core::TaskInterface::request(TaskInterface *this,KeyType *key,uintptr_t inputID)

{
  BuildEngineImpl *this_00;
  BuildEngineDelegate *pBVar1;
  Twine local_30;
  
  this_00 = (BuildEngineImpl *)this->impl;
  if (0xffffffffffffff00 < inputID) {
    pBVar1 = this_00->delegate;
    llvm::Twine::Twine(&local_30,"attempt to use reserved input ID");
    (*pBVar1->_vptr_BuildEngineDelegate[7])(pBVar1,&local_30);
    LOCK();
    (this_00->buildCancelled)._M_base._M_i = true;
    UNLOCK();
    return;
  }
  anon_unknown.dwarf_157793::BuildEngineImpl::addTaskInputRequest
            (this_00,(Task *)this->ctx,key,inputID,false,false);
  return;
}

Assistant:

void TaskInterface::request(const KeyType& key, uintptr_t inputID) {
  Task* task = static_cast<Task*>(ctx);
  static_cast<BuildEngineImpl*>(impl)->taskNeedsInput(task, key, inputID);
}